

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void multi_deltimeout(Curl_easy *data,expire_id eid)

{
  Curl_llist_node *n;
  void *pvVar1;
  
  n = Curl_llist_head(&(data->state).timeoutlist);
  while( true ) {
    if (n == (Curl_llist_node *)0x0) {
      return;
    }
    pvVar1 = Curl_node_elem(n);
    if (*(expire_id *)((long)pvVar1 + 0x30) == eid) break;
    n = Curl_node_next(n);
  }
  Curl_node_remove(n);
  return;
}

Assistant:

static void
multi_deltimeout(struct Curl_easy *data, expire_id eid)
{
  struct Curl_llist_node *e;
  struct Curl_llist *timeoutlist = &data->state.timeoutlist;
  /* find and remove the specific node from the list */
  for(e = Curl_llist_head(timeoutlist); e; e = Curl_node_next(e)) {
    struct time_node *n = Curl_node_elem(e);
    if(n->eid == eid) {
      Curl_node_remove(e);
      return;
    }
  }
}